

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_FEA_basic.cpp
# Opt level: O3

void test_2(void)

{
  ChStreamOutAscii *pCVar1;
  ChElementTetraCorot_4 *this;
  ChBody *__p;
  ChNodeFEAxyz **size;
  ChMesh **size_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  shared_ptr<chrono::ChBody> truss;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode4;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode2;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode3;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode1;
  shared_ptr<chrono::fea::ChMesh> my_mesh;
  shared_ptr<chrono::fea::ChLinkPointFrame> constraint3;
  shared_ptr<chrono::fea::ChLinkPointFrame> constraint2;
  shared_ptr<chrono::fea::ChLinkPointFrame> constraint1;
  shared_ptr<chrono::fea::ChElementTetraCorot_4> melement1;
  shared_ptr<chrono::fea::ChContinuumElastic> mmaterial;
  shared_ptr<chrono::ChSolverMINRES> solver;
  ChSystemSMC sys;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_610;
  ChNodeFEAxyz *local_608;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_600;
  ChNodeFEAxyz *local_5f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_5f0;
  ChNodeFEAxyz *local_5e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_5e0;
  ChNodeFEAxyz *local_5d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_5d0;
  ChMesh *local_5c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_5c0;
  ChVector<double> local_5b8;
  ChLinkPointFrame *local_598;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_590;
  ChLinkPointFrame *local_588;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_580;
  ChLinkPointFrame *local_578;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_570;
  ChElementTetraCorot_4 *local_568;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_560;
  ChContinuumElastic *local_558;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_550;
  ChSolverMINRES *local_548;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_540;
  ChSolverMINRES *local_538;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_530;
  ChBody *local_528;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_520;
  ChBody *local_518;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_510;
  ChBody *local_508;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_500;
  ChElementTetraCorot_4 *local_4f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_4f0;
  ChLinkPointFrame *local_4e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_4e0;
  ChLinkPointFrame *local_4d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_4d0;
  ChLinkPointFrame *local_4c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_4c0;
  ChNodeFEAxyz *local_4b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_4b0;
  ChNodeFEAxyz *local_4a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_4a0;
  ChNodeFEAxyz *local_498;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_490;
  ChBody *local_488;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_480;
  ChMesh *local_478;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_470;
  ChNodeFEAxyz *local_468;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_460;
  ChNodeFEAxyz *local_458;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_450;
  ChNodeFEAxyz *local_448;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_440;
  ChNodeFEAxyz *local_438;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_430;
  ChNodeFEAxyz *local_428;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_420;
  ChNodeFEAxyz *local_418;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_410;
  ChNodeFEAxyz *local_408;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_400;
  ChNodeFEAxyz *local_3f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_3f0;
  ChContinuumElastic *local_3e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3e0;
  undefined1 local_3d8 [16];
  undefined8 local_3c8;
  code *local_3b8 [116];
  long *local_18;
  
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<
            (pCVar1,"\n-------------------------------------------------\n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar1,"TEST: LINEAR tetrahedral element FEM  \n\n");
  chrono::ChSystemSMC::ChSystemSMC((ChSystemSMC *)local_3b8,true);
  local_5c8 = (ChMesh *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChMesh,std::allocator<chrono::fea::ChMesh>>
            (&_Stack_5c0,&local_5c8,(allocator<chrono::fea::ChMesh> *)&local_5b8);
  local_558 = (ChContinuumElastic *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChContinuumElastic,std::allocator<chrono::fea::ChContinuumElastic>>
            (&local_550,&local_558,(allocator<chrono::fea::ChContinuumElastic> *)&local_5b8);
  chrono::fea::ChContinuumElastic::Set_E(10000000.0);
  chrono::fea::ChContinuumElastic::Set_v(0.3);
  local_5b8.m_data[2] = 0.0;
  local_5b8.m_data._0_16_ = ZEXT816(0);
  local_5d8 = (ChNodeFEAxyz *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChNodeFEAxyz,std::allocator<chrono::fea::ChNodeFEAxyz>,chrono::ChVector<double>>
            (&_Stack_5d0,&local_5d8,(allocator<chrono::fea::ChNodeFEAxyz> *)&local_5f8,&local_5b8);
  local_5b8.m_data._0_16_ = ZEXT816(0);
  local_5b8.m_data[2] = 1.0;
  local_5f8 = (ChNodeFEAxyz *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChNodeFEAxyz,std::allocator<chrono::fea::ChNodeFEAxyz>,chrono::ChVector<double>>
            (&_Stack_5f0,&local_5f8,(allocator<chrono::fea::ChNodeFEAxyz> *)&local_5e8,&local_5b8);
  local_5b8.m_data._0_16_ = vmovhps_avx(ZEXT816(0) << 0x40,0x3ff0000000000000);
  local_5e8 = (ChNodeFEAxyz *)0x0;
  local_5b8.m_data[2] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChNodeFEAxyz,std::allocator<chrono::fea::ChNodeFEAxyz>,chrono::ChVector<double>>
            (&_Stack_5e0,&local_5e8,(allocator<chrono::fea::ChNodeFEAxyz> *)&local_608,&local_5b8);
  local_5b8.m_data._0_16_ = ZEXT816(0x3ff0000000000000);
  local_5b8.m_data[2] = 0.0;
  local_608 = (ChNodeFEAxyz *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChNodeFEAxyz,std::allocator<chrono::fea::ChNodeFEAxyz>,chrono::ChVector<double>>
            (&_Stack_600,&local_608,(allocator<chrono::fea::ChNodeFEAxyz> *)&local_568,&local_5b8);
  local_3d8 = vmovhps_avx(ZEXT816(0) << 0x40,0x40c3880000000000);
  local_3c8 = 0;
  (**(code **)(*(long *)local_5e8 + 0x68))();
  local_3f8 = local_5d8;
  p_Stack_3f0 = _Stack_5d0._M_pi;
  if (_Stack_5d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_5d0._M_pi)->_M_use_count = (_Stack_5d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_5d0._M_pi)->_M_use_count = (_Stack_5d0._M_pi)->_M_use_count + 1;
    }
  }
  chrono::fea::ChMesh::AddNode(local_5c8,&local_3f8);
  if (p_Stack_3f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_3f0);
  }
  local_408 = local_5f8;
  p_Stack_400 = _Stack_5f0._M_pi;
  if (_Stack_5f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_5f0._M_pi)->_M_use_count = (_Stack_5f0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_5f0._M_pi)->_M_use_count = (_Stack_5f0._M_pi)->_M_use_count + 1;
    }
  }
  chrono::fea::ChMesh::AddNode(local_5c8,&local_408);
  if (p_Stack_400 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_400);
  }
  local_418 = local_5e8;
  p_Stack_410 = _Stack_5e0._M_pi;
  if (_Stack_5e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_5e0._M_pi)->_M_use_count = (_Stack_5e0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_5e0._M_pi)->_M_use_count = (_Stack_5e0._M_pi)->_M_use_count + 1;
    }
  }
  chrono::fea::ChMesh::AddNode(local_5c8,&local_418);
  if (p_Stack_410 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_410);
  }
  local_428 = local_608;
  p_Stack_420 = _Stack_600._M_pi;
  if (_Stack_600._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_600._M_pi)->_M_use_count = (_Stack_600._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_600._M_pi)->_M_use_count = (_Stack_600._M_pi)->_M_use_count + 1;
    }
  }
  size = &local_428;
  chrono::fea::ChMesh::AddNode(local_5c8);
  if (p_Stack_420 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_420);
  }
  this = (ChElementTetraCorot_4 *)
         chrono::fea::ChElementTetraCorot_4::operator_new
                   ((ChElementTetraCorot_4 *)0x1c0,(size_t)size);
  chrono::fea::ChElementTetraCorot_4::ChElementTetraCorot_4(this);
  local_568 = this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChElementTetraCorot_4*>(&local_560,this);
  local_438 = local_5d8;
  p_Stack_430 = _Stack_5d0._M_pi;
  if (_Stack_5d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_5d0._M_pi)->_M_use_count = (_Stack_5d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_5d0._M_pi)->_M_use_count = (_Stack_5d0._M_pi)->_M_use_count + 1;
    }
  }
  local_448 = local_5f8;
  p_Stack_440 = _Stack_5f0._M_pi;
  if (_Stack_5f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_5f0._M_pi)->_M_use_count = (_Stack_5f0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_5f0._M_pi)->_M_use_count = (_Stack_5f0._M_pi)->_M_use_count + 1;
    }
  }
  local_458 = local_5e8;
  p_Stack_450 = _Stack_5e0._M_pi;
  if (_Stack_5e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_5e0._M_pi)->_M_use_count = (_Stack_5e0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_5e0._M_pi)->_M_use_count = (_Stack_5e0._M_pi)->_M_use_count + 1;
    }
  }
  local_468 = local_608;
  p_Stack_460 = _Stack_600._M_pi;
  if (_Stack_600._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_600._M_pi)->_M_use_count = (_Stack_600._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_600._M_pi)->_M_use_count = (_Stack_600._M_pi)->_M_use_count + 1;
    }
  }
  (**(code **)(*(long *)local_568 + 0x38))(local_568,&local_438,&local_448,&local_458,&local_468);
  if (p_Stack_460 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_460);
  }
  if (p_Stack_450 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_450);
  }
  if (p_Stack_440 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_440);
  }
  if (p_Stack_430 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_430);
  }
  local_3e8 = local_558;
  local_3e0._M_pi = local_550._M_pi;
  if (local_550._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_550._M_pi)->_M_use_count = (local_550._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_550._M_pi)->_M_use_count = (local_550._M_pi)->_M_use_count + 1;
    }
  }
  *(ChContinuumElastic **)(local_568 + 0xb8) = local_558;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_568 + 0xc0),&local_3e0);
  if (local_3e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3e0._M_pi);
  }
  local_4f8 = local_568 + 8;
  if (local_568 == (ChElementTetraCorot_4 *)0x0) {
    local_4f8 = (ChElementTetraCorot_4 *)0x0;
  }
  local_4f0 = local_560._M_pi;
  if (local_560._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_560._M_pi)->_M_use_count = (local_560._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_560._M_pi)->_M_use_count = (local_560._M_pi)->_M_use_count + 1;
    }
  }
  chrono::fea::ChMesh::AddElement(local_5c8,&local_4f8);
  if (local_4f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4f0);
  }
  local_478 = local_5c8;
  p_Stack_470 = _Stack_5c0._M_pi;
  if (_Stack_5c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_5c0._M_pi)->_M_use_count = (_Stack_5c0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_5c0._M_pi)->_M_use_count = (_Stack_5c0._M_pi)->_M_use_count + 1;
    }
  }
  size_00 = &local_478;
  chrono::ChSystem::Add(local_3b8);
  if (p_Stack_470 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_470);
  }
  __p = (ChBody *)chrono::ChFrame<double>::operator_new((ChFrame<double> *)0x360,(size_t)size_00);
  chrono::ChBody::ChBody(__p,0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChBody*>(&_Stack_610,__p);
  chrono::ChBody::SetBodyFixed(SUB81(__p,0));
  p_Stack_480 = _Stack_610._M_pi;
  if (_Stack_610._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_610._M_pi)->_M_use_count = (_Stack_610._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_610._M_pi)->_M_use_count = (_Stack_610._M_pi)->_M_use_count + 1;
    }
  }
  local_488 = __p;
  chrono::ChSystem::Add(local_3b8,&local_488);
  if (p_Stack_480 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_480);
  }
  local_578 = (ChLinkPointFrame *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChLinkPointFrame,std::allocator<chrono::fea::ChLinkPointFrame>>
            (&_Stack_570,&local_578,(allocator<chrono::fea::ChLinkPointFrame> *)&local_5b8);
  local_588 = (ChLinkPointFrame *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChLinkPointFrame,std::allocator<chrono::fea::ChLinkPointFrame>>
            (&_Stack_580,&local_588,(allocator<chrono::fea::ChLinkPointFrame> *)&local_5b8);
  local_598 = (ChLinkPointFrame *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChLinkPointFrame,std::allocator<chrono::fea::ChLinkPointFrame>>
            (&_Stack_590,&local_598,(allocator<chrono::fea::ChLinkPointFrame> *)&local_5b8);
  local_498 = local_5d8;
  p_Stack_490 = _Stack_5d0._M_pi;
  if (_Stack_5d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_5d0._M_pi)->_M_use_count = (_Stack_5d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_5d0._M_pi)->_M_use_count = (_Stack_5d0._M_pi)->_M_use_count + 1;
    }
  }
  local_508 = __p + 0x78;
  if (__p == (ChBody *)0x0) {
    local_508 = (ChBody *)0x0;
  }
  local_500 = _Stack_610._M_pi;
  if (_Stack_610._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_610._M_pi)->_M_use_count = (_Stack_610._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_610._M_pi)->_M_use_count = (_Stack_610._M_pi)->_M_use_count + 1;
    }
  }
  (**(code **)(*(long *)local_578 + 0x220))(local_578,&local_498,&local_508,0);
  if (local_500 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_500);
  }
  if (p_Stack_490 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_490);
  }
  local_4a8 = local_5f8;
  p_Stack_4a0 = _Stack_5f0._M_pi;
  if (_Stack_5f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_5f0._M_pi)->_M_use_count = (_Stack_5f0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_5f0._M_pi)->_M_use_count = (_Stack_5f0._M_pi)->_M_use_count + 1;
    }
  }
  local_518 = __p + 0x78;
  if (__p == (ChBody *)0x0) {
    local_518 = (ChBody *)0x0;
  }
  local_510 = _Stack_610._M_pi;
  if (_Stack_610._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_610._M_pi)->_M_use_count = (_Stack_610._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_610._M_pi)->_M_use_count = (_Stack_610._M_pi)->_M_use_count + 1;
    }
  }
  (**(code **)(*(long *)local_588 + 0x220))(local_588,&local_4a8,&local_518,0);
  if (local_510 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_510);
  }
  if (p_Stack_4a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_4a0);
  }
  local_4b8 = local_608;
  p_Stack_4b0 = _Stack_600._M_pi;
  if (_Stack_600._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_600._M_pi)->_M_use_count = (_Stack_600._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_600._M_pi)->_M_use_count = (_Stack_600._M_pi)->_M_use_count + 1;
    }
  }
  local_528 = __p + 0x78;
  if (__p == (ChBody *)0x0) {
    local_528 = (ChBody *)0x0;
  }
  local_520 = _Stack_610._M_pi;
  if (_Stack_610._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_610._M_pi)->_M_use_count = (_Stack_610._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_610._M_pi)->_M_use_count = (_Stack_610._M_pi)->_M_use_count + 1;
    }
  }
  (**(code **)(*(long *)local_598 + 0x220))(local_598,&local_4b8,&local_528,0);
  if (local_520 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_520);
  }
  if (p_Stack_4b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_4b0);
  }
  local_4c8 = local_578;
  p_Stack_4c0 = _Stack_570._M_pi;
  if (_Stack_570._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_570._M_pi)->_M_use_count = (_Stack_570._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_570._M_pi)->_M_use_count = (_Stack_570._M_pi)->_M_use_count + 1;
    }
  }
  chrono::ChSystem::Add(local_3b8,&local_4c8);
  if (p_Stack_4c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_4c0);
  }
  local_4d8 = local_588;
  p_Stack_4d0 = _Stack_580._M_pi;
  if (_Stack_580._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_580._M_pi)->_M_use_count = (_Stack_580._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_580._M_pi)->_M_use_count = (_Stack_580._M_pi)->_M_use_count + 1;
    }
  }
  chrono::ChSystem::Add(local_3b8,&local_4d8);
  if (p_Stack_4d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_4d0);
  }
  local_4e8 = local_598;
  p_Stack_4e0 = _Stack_590._M_pi;
  if (_Stack_590._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_590._M_pi)->_M_use_count = (_Stack_590._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_590._M_pi)->_M_use_count = (_Stack_590._M_pi)->_M_use_count + 1;
    }
  }
  chrono::ChSystem::Add(local_3b8,&local_4e8);
  if (p_Stack_4e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_4e0);
  }
  local_548 = (ChSolverMINRES *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChSolverMINRES,std::allocator<chrono::ChSolverMINRES>>
            (&local_540,&local_548,(allocator<chrono::ChSolverMINRES> *)&local_5b8);
  local_538 = local_548 + 0x18;
  if (local_548 == (ChSolverMINRES *)0x0) {
    local_538 = (ChSolverMINRES *)0x0;
  }
  local_530 = local_540._M_pi;
  if (local_540._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_540._M_pi)->_M_use_count = (local_540._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_540._M_pi)->_M_use_count = (local_540._M_pi)->_M_use_count + 1;
    }
  }
  chrono::ChSystem::SetSolver(local_3b8,&local_538);
  if (local_530 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_530);
  }
  *(undefined4 *)(local_548 + 0xc) = 100;
  *(undefined8 *)(local_548 + 0x10) = 0x3ddb7cdfd9d7bdbb;
  local_548[8] = (ChSolverMINRES)0x1;
  local_548[0x20] = (ChSolverMINRES)0x1;
  chrono::ChSystem::DoStaticLinear();
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar1,"Resulting node positions:\n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,(ChVector<double> *)(local_5d8 + 0x20));
  chrono::ChStreamOutAscii::operator<<(pCVar1,"\n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,(ChVector<double> *)(local_5f8 + 0x20));
  chrono::ChStreamOutAscii::operator<<(pCVar1,"\n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,(ChVector<double> *)(local_5e8 + 0x20));
  chrono::ChStreamOutAscii::operator<<(pCVar1,"\n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = chrono::operator<<(pCVar1,(ChVector<double> *)(local_608 + 0x20));
  chrono::ChStreamOutAscii::operator<<(pCVar1,"\n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar1,"Resulting constraint reactions:\n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  auVar2._0_8_ = *(ulong *)(local_578 + 0x88) ^ 0x8000000000000000;
  auVar2._8_4_ = 0;
  auVar2._12_4_ = 0x80000000;
  local_5b8.m_data[0] = -*(double *)(local_578 + 0x78);
  local_5b8.m_data[1]._0_4_ = *(undefined4 *)(local_578 + 0x80);
  local_5b8.m_data[1]._4_4_ = *(uint *)(local_578 + 0x84) ^ 0x80000000;
  local_5b8.m_data[2] = (double)vmovlps_avx(auVar2);
  chrono::operator<<(pCVar1,&local_5b8);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  auVar3._0_8_ = *(ulong *)(local_588 + 0x88) ^ 0x8000000000000000;
  auVar3._8_4_ = 0;
  auVar3._12_4_ = 0x80000000;
  local_5b8.m_data[0] = -*(double *)(local_588 + 0x78);
  local_5b8.m_data[1]._0_4_ = *(undefined4 *)(local_588 + 0x80);
  local_5b8.m_data[1]._4_4_ = *(uint *)(local_588 + 0x84) ^ 0x80000000;
  local_5b8.m_data[2] = (double)vmovlps_avx(auVar3);
  chrono::operator<<(pCVar1,&local_5b8);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  auVar4._0_8_ = *(ulong *)(local_598 + 0x88) ^ 0x8000000000000000;
  auVar4._8_4_ = 0;
  auVar4._12_4_ = 0x80000000;
  local_5b8.m_data[0] = -*(double *)(local_598 + 0x78);
  local_5b8.m_data[1]._0_4_ = *(undefined4 *)(local_598 + 0x80);
  local_5b8.m_data[1]._4_4_ = *(uint *)(local_598 + 0x84) ^ 0x80000000;
  local_5b8.m_data[2] = (double)vmovlps_avx(auVar4);
  chrono::operator<<(pCVar1,&local_5b8);
  if (local_540._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_540._M_pi);
  }
  if (_Stack_590._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_590._M_pi);
  }
  if (_Stack_580._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_580._M_pi);
  }
  if (_Stack_570._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_570._M_pi);
  }
  if (_Stack_610._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_610._M_pi);
  }
  if (local_560._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_560._M_pi);
  }
  if (_Stack_600._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_600._M_pi);
  }
  if (_Stack_5e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_5e0._M_pi);
  }
  if (_Stack_5f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_5f0._M_pi);
  }
  if (_Stack_5d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_5d0._M_pi);
  }
  if (local_550._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_550._M_pi);
  }
  if (_Stack_5c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_5c0._M_pi);
  }
  local_3b8[0] = chrono::ChSystemSMC::ChSystemSMC;
  if (local_18 != (long *)0x0) {
    (**(code **)(*local_18 + 8))();
  }
  local_18 = (long *)0x0;
  chrono::ChSystem::~ChSystem((ChSystem *)local_3b8);
  return;
}

Assistant:

void test_2() {
    GetLog() << "\n-------------------------------------------------\n";
    GetLog() << "TEST: LINEAR tetrahedral element FEM  \n\n";

    // The physical system: it contains all physical objects.
    ChSystemSMC sys;

    // Create a mesh, that is a container for groups
    // of elements and their referenced nodes.
    auto my_mesh = chrono_types::make_shared<ChMesh>();

    // Create a material, that must be assigned to each element,
    // and set its parameters
    auto mmaterial = chrono_types::make_shared<ChContinuumElastic>();
    mmaterial->Set_E(0.01e9);  // rubber 0.01e9, steel 200e9
    mmaterial->Set_v(0.3);

    // Create some nodes. These are the classical point-like
    // nodes with x,y,z degrees of freedom, that can be used
    // for many types of FEM elements in space.
    // While creating them, also set X0 undeformed positions.
    auto mnode1 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, 0, 0));
    auto mnode2 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, 0, 1));
    auto mnode3 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, 1, 0));
    auto mnode4 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(1, 0, 0));

    // For example, set an applied force to a node:
    mnode3->SetForce(ChVector<>(0, 10000, 0));

    // Remember to add nodes and elements to the mesh!
    my_mesh->AddNode(mnode1);
    my_mesh->AddNode(mnode2);
    my_mesh->AddNode(mnode3);
    my_mesh->AddNode(mnode4);

    // Create the tetrahedron element, and assign
    // nodes and material
    auto melement1 = chrono_types::make_shared<ChElementTetraCorot_4>();
    melement1->SetNodes(mnode1, mnode2, mnode3, mnode4);
    melement1->SetMaterial(mmaterial);

    // Remember to add elements to the mesh!
    my_mesh->AddElement(melement1);

    // Remember to add the mesh to the system!
    sys.Add(my_mesh);

    // Create also a truss
    auto truss = chrono_types::make_shared<ChBody>();
    truss->SetBodyFixed(true);
    sys.Add(truss);

    // Create a constraint between a node and the truss
    auto constraint1 = chrono_types::make_shared<ChLinkPointFrame>();
    auto constraint2 = chrono_types::make_shared<ChLinkPointFrame>();
    auto constraint3 = chrono_types::make_shared<ChLinkPointFrame>();

    constraint1->Initialize(mnode1,   // node
                            truss);   // body to be connected to

    constraint2->Initialize(mnode2,  // node 
                            truss);   // body to be connected to

    constraint3->Initialize(mnode4,  // node
                            truss);   // body to be connected to

    sys.Add(constraint1);
    sys.Add(constraint2);
    sys.Add(constraint3);

    // Set no gravity
    // sys.Set_G_acc(VNULL);

    // Perform a linear static analysis
    auto solver = chrono_types::make_shared<ChSolverMINRES>();
    sys.SetSolver(solver);
    solver->SetMaxIterations(100);
    solver->SetTolerance(1e-10);
    solver->EnableDiagonalPreconditioner(true);
    solver->SetVerbose(true);

    sys.DoStaticLinear();

    // Output result
    GetLog() << "Resulting node positions:\n";
    GetLog() << mnode1->pos << "\n";
    GetLog() << mnode2->pos << "\n";
    GetLog() << mnode3->pos << "\n";
    GetLog() << mnode4->pos << "\n";

    GetLog() << "Resulting constraint reactions:\n";
    GetLog() << constraint1->GetReactionOnBody();
    GetLog() << constraint2->GetReactionOnBody();
    GetLog() << constraint3->GetReactionOnBody();
}